

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void isFuncMatchCpStr(attr *exp,char *buf)

{
  attr *in_RSI;
  undefined4 *in_RDI;
  char buf2 [32];
  char local_38 [32];
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI != (undefined4 *)0x0) {
    switch(*in_RDI) {
    case 0:
      if (*(int *)(*(long *)(in_RDI + 2) + 8) == 2) {
        strcat((char *)in_RSI,"int");
      }
      else if (*(int *)(*(long *)(in_RDI + 2) + 8) == 5) {
        strcat((char *)in_RSI,"float");
      }
      break;
    case 1:
      isFuncMatchCpStr(in_RSI,in_stack_ffffffffffffffe8);
      sprintf(local_38,"[%d]",(ulong)*(uint *)(*(long *)(in_RDI + 2) + 8));
      strcat((char *)in_RSI,local_38);
      break;
    case 2:
      strcat((char *)in_RSI,"struct ");
      strcat((char *)in_RSI,(char *)**(undefined8 **)(in_RDI + 2));
      break;
    case 3:
      isFuncMatchCpStr(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static void isFuncMatchCpStr(struct attr *exp, char *buf) {
    if (!exp)
        return;
    switch (exp->kind) {
        case BASIC:
            switch (exp->basic->type) {
                case INT_T:
                    strcat(buf, "int");
                    break;
                case FLOAT_T:
                    strcat(buf, "float");
                    break;
                default:
                    break;
            }
            break;
        case STRUCTURE:
            strcat(buf, "struct ");
            strcat(buf, exp->structure->name);
            break;
        case ARRAY: {
            char buf2[32];
            isFuncMatchCpStr(exp->array->type, buf);
            sprintf(buf2, "[%d]", exp->array->size);
            strcat(buf, buf2);
            break;
        }
        case FUNCTION:
            isFuncMatchCpStr(exp->function->return_type, buf);
            break;
        default:
            //DONETODO: check more type
            break;
    }
}